

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

void dec_free_mi(CommonModeInfoParams *mi_params)

{
  long in_RDI;
  
  aom_free(mi_params);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  aom_free(mi_params);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  aom_free(mi_params);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

static void dec_free_mi(CommonModeInfoParams *mi_params) {
  aom_free(mi_params->mi_alloc);
  mi_params->mi_alloc = NULL;
  mi_params->mi_alloc_size = 0;
  aom_free(mi_params->mi_grid_base);
  mi_params->mi_grid_base = NULL;
  mi_params->mi_grid_size = 0;
  aom_free(mi_params->tx_type_map);
  mi_params->tx_type_map = NULL;
}